

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::CBString(CBString *this,tagbstring *x)

{
  uchar *puVar1;
  CBStringException *this_00;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  tagbstring *x_local;
  CBString *this_local;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_0026f840;
  (this->super_tagbstring).slen = x->slen;
  (this->super_tagbstring).mlen = (this->super_tagbstring).slen + 1;
  (this->super_tagbstring).data = (uchar *)0x0;
  bstr__cppwrapper_exception.msg.field_2._8_8_ = x;
  if ((-1 < (this->super_tagbstring).slen) && (x->data != (uchar *)0x0)) {
    puVar1 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
    (this->super_tagbstring).data = puVar1;
  }
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_60,"CBString::Failure in (tagbstring) constructor",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_40);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  memcpy((this->super_tagbstring).data,*(void **)(bstr__cppwrapper_exception.msg.field_2._8_8_ + 8),
         (long)(this->super_tagbstring).slen);
  (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  return;
}

Assistant:

CBString::CBString (const tagbstring& x) {
	slen = x.slen;
	mlen = slen + 1;
	data = NULL;
	if (slen >= 0 && x.data != NULL) data = (unsigned char *) bstr__alloc (mlen);
	if (!data) {
		bstringThrow ("Failure in (tagbstring) constructor");
	} else {
		bstr__memcpy (data, x.data, slen);
		data[slen] = '\0';
	}
}